

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Waving.h
# Opt level: O2

void __thiscall
WavingSketch<8U,_16U,_8U>::Init(WavingSketch<8U,_16U,_8U> *this,Data<8U> *item,uint time)

{
  byte bVar1;
  uchar *puVar2;
  ulong uVar3;
  uint position;
  uint uVar4;
  uint i;
  uint num;
  bool bVar5;
  
  if (this->record < time) {
    this->record = time;
    memset(this->bitset->bitset,0,(ulong)(this->bitset->LENGTH >> 3) + 1);
  }
  bVar5 = true;
  for (num = 0; num < this->HASH_NUM; num = num + 1) {
    uVar4 = Data<8U>::Hash(item,num);
    uVar3 = (ulong)uVar4 % (ulong)this->LENGTH;
    puVar2 = this->bitset->bitset;
    bVar1 = puVar2[uVar3 >> 3];
    if ((bVar1 >> ((uint)uVar3 & 7) & 1) == 0) {
      puVar2[uVar3 >> 3] = (byte)(1 << ((byte)uVar3 & 7)) | bVar1;
      bVar5 = false;
    }
  }
  if (bVar5) {
    return;
  }
  (**(this->super_Abstract<8U>)._vptr_Abstract)(this,item);
  return;
}

Assistant:

void Init(const Data<DATA_LEN>& item, uint time) {
		if (time > record) {
			record = time;
			bitset->Clear();
		}

		bool init = true;
		for (uint i = 0; i < HASH_NUM; ++i) {
			uint position = item.Hash(i) % LENGTH;
			if (!bitset->Get(position)) {
				init = false;
				bitset->Set(position);
			}
		}

		if (!init) Init(item);
	}